

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandInsWin(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Io_FileType_t FileType;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Ntk_t *pNtkTemp;
  int fVerbose;
  int nDist;
  int nObjId;
  int c;
  Abc_Ntk_t *pNtkCare;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = -1;
  pNtkTemp._4_4_ = 5;
  pNtkTemp._0_4_ = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"NDvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          Abc_Print(-1,"Only works for structrally hashed networks.\n");
          return 1;
        }
        if (argc != globalUtilOptind + 1) {
          Abc_Print(-1,"Not enough command-line arguments.\n");
          return 1;
        }
        pcVar3 = argv[globalUtilOptind];
        FileType = Io_ReadFileType(argv[globalUtilOptind]);
        pNtk_00 = Io_Read(pcVar3,FileType,1,0);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Reading care network has failed.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsStrash(pNtk_00);
        _nObjId = pNtk_00;
        if (iVar1 == 0) {
          _nObjId = Abc_NtkStrash(pNtk_00,0,1,0);
          Abc_NtkDelete(pNtk_00);
        }
        pAVar2 = Abc_NtkDarInsWin(pAVar2,_nObjId,fVerbose,pNtkTemp._4_4_,(uint)pNtkTemp);
        Abc_NtkDelete(_nObjId);
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Inserting sequential window has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      if (iVar1 == 0x44) break;
      if (iVar1 == 0x4e) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
          goto LAB_0024a975;
        }
        fVerbose = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (fVerbose < 1) goto LAB_0024a975;
      }
      else {
        if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0024a975;
        pNtkTemp._0_4_ = (uint)pNtkTemp ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      break;
    }
    pNtkTemp._4_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (0 < (int)pNtkTemp._4_4_);
LAB_0024a975:
  Abc_Print(-2,"usage: inswin [-ND <num>] [-vh] <file>\n");
  Abc_Print(-2,"\t         inserts sequential window into the AIG\n");
  Abc_Print(-2,"\t-N num : the ID of the object to use as the center [default = %d]\n",
            (ulong)(uint)fVerbose);
  Abc_Print(-2,"\t-D num : the \"radius\" of the window [default = %d]\n",(ulong)pNtkTemp._4_4_);
  pcVar3 = "no";
  if ((uint)pNtkTemp != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\tfile   : file with the AIG to be inserted\n");
  return 1;
}

Assistant:

int Abc_CommandInsWin( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkRes, * pNtk, * pNtkCare;
    int c;
    int nObjId;
    int nDist;
    int fVerbose;

    extern Abc_Ntk_t * Abc_NtkDarInsWin( Abc_Ntk_t * pNtk, Abc_Ntk_t * pWnd, int nObjId, int nDist, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nObjId   = -1;
    nDist    =  5;
    fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NDvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nObjId = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nObjId <= 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nDist = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nDist <= 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }

    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Not enough command-line arguments.\n" );
        return 1;
    }
    pNtkCare = Io_Read( argv[globalUtilOptind], Io_ReadFileType(argv[globalUtilOptind]), 1, 0 );
    if ( pNtkCare == NULL )
    {
        Abc_Print( -1, "Reading care network has failed.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtkCare) )
    {
        Abc_Ntk_t * pNtkTemp;
        pNtkCare = Abc_NtkStrash( pNtkTemp = pNtkCare, 0, 1, 0 );
        Abc_NtkDelete( pNtkTemp );
    }
    // modify the current network
    pNtkRes = Abc_NtkDarInsWin( pNtk, pNtkCare, nObjId, nDist, fVerbose );
    Abc_NtkDelete( pNtkCare );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Inserting sequential window has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: inswin [-ND <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t         inserts sequential window into the AIG\n" );
    Abc_Print( -2, "\t-N num : the ID of the object to use as the center [default = %d]\n", nObjId );
    Abc_Print( -2, "\t-D num : the \"radius\" of the window [default = %d]\n", nDist );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile   : file with the AIG to be inserted\n");
    return 1;
}